

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O3

int get_parts(void)

{
  CURLUcode CVar1;
  uint uVar2;
  bool bVar3;
  CURLUcode CVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  testcase *ptVar13;
  char buf [256];
  long local_150;
  char *local_148;
  char *local_140;
  char local_138 [264];
  
  pcVar10 = "user:moo@ftp.example.com/color/#green?no-black";
  lVar12 = 0;
  ptVar13 = get_parts_list;
  do {
    lVar5 = curl_url();
    if (lVar5 == 0) {
      return 1;
    }
    CVar1 = ptVar13->ucode;
    CVar4 = curl_url_set(lVar5,0,pcVar10,ptVar13->urlflags);
    if (CVar4 == CVar1) {
      iVar8 = 0;
      bVar3 = true;
      local_140 = pcVar10;
      if (CVar4 == CURLUE_OK) {
        local_148 = ptVar13->out;
        uVar2 = ptVar13->getflags;
        local_138[0] = '\0';
        lVar11 = 0x100;
        lVar9 = 0;
        pcVar10 = local_138;
        do {
          local_150 = 0;
          iVar8 = curl_url_get(lVar5,*(undefined4 *)((long)&DAT_0010ad00 + lVar9),&local_150,uVar2);
          pcVar7 = " | ";
          if (local_138[0] == '\0') {
            pcVar7 = "";
          }
          if (local_150 == 0 || iVar8 != 0) {
            curl_msnprintf(pcVar10,lVar11,"%s[%d]",pcVar7,iVar8);
          }
          else {
            curl_msnprintf(pcVar10,lVar11,"%s%s",pcVar7);
          }
          sVar6 = strlen(pcVar10);
          pcVar10 = pcVar10 + sVar6;
          lVar11 = lVar11 - sVar6;
          curl_free(local_150);
          pcVar7 = local_148;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x90);
        iVar8 = strcmp(local_138,local_148);
        if (iVar8 != 0) {
          curl_mfprintf(_stderr,"in: %s\nwanted: %s\ngot:    %s\n",local_140,pcVar7,local_138);
          goto LAB_00104fc9;
        }
        iVar8 = 0;
      }
    }
    else {
      curl_mfprintf(_stderr,"Get parts\nin: %s\nreturned %d (expected %d)\n",pcVar10,CVar4,CVar1);
LAB_00104fc9:
      bVar3 = false;
      iVar8 = 1;
    }
    curl_url_cleanup(lVar5);
    lVar12 = lVar12 + 1;
    pcVar10 = get_parts_list[lVar12].in;
    if (pcVar10 == (char *)0x0) {
      return iVar8;
    }
    ptVar13 = get_parts_list + lVar12;
    if (!bVar3) {
      return iVar8;
    }
  } while( true );
}

Assistant:

static int get_parts(void)
{
  int i;
  int error = 0;
  for(i = 0; get_parts_list[i].in && !error; i++) {
    CURLUcode rc;
    CURLU *urlp = curl_url();
    if(!urlp) {
      error++;
      break;
    }
    rc = curl_url_set(urlp, CURLUPART_URL,
                      get_parts_list[i].in,
                      get_parts_list[i].urlflags);
    if(rc != get_parts_list[i].ucode) {
      fprintf(stderr, "Get parts\nin: %s\nreturned %d (expected %d)\n",
              get_parts_list[i].in, (int)rc, get_parts_list[i].ucode);
      error++;
    }
    else if(get_parts_list[i].ucode) {
      /* the expected error happened */
    }
    else if(checkparts(urlp, get_parts_list[i].in, get_parts_list[i].out,
                       get_parts_list[i].getflags))
      error++;
    curl_url_cleanup(urlp);
  }
  return error;
}